

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeGuard.h
# Opt level: O3

void __thiscall
idx2::
scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:493:3)>
::~scope_guard(scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:493:3)>
               *this)

{
  if ((this->Dismissed == false) && (((this->Func).P)->OutMode == RegularGridFile)) {
    Unmap((this->Func).OutVolFile);
  }
  return;
}

Assistant:

~scope_guard()
  {
    if (!Dismissed)
    {
      Func();
    }
  }